

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.hpp
# Opt level: O3

void __thiscall
duckdb::CSVColumnInfo::CSVColumnInfo(CSVColumnInfo *this,string *name_p,LogicalType *type_p)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_p->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + name_p->_M_string_length);
  LogicalType::LogicalType(&this->type,type_p);
  return;
}

Assistant:

CSVColumnInfo(const string &name_p, const LogicalType &type_p) : name(name_p), type(type_p) {
	}